

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_tile_header
                   (opj_j2k_v2_t *p_j2k,OPJ_UINT32 *p_tile_index,OPJ_UINT32 *p_data_size,
                   OPJ_INT32 *p_tile_x0,OPJ_INT32 *p_tile_y0,OPJ_INT32 *p_tile_x1,
                   OPJ_INT32 *p_tile_y1,OPJ_UINT32 *p_nb_comps,opj_bool *p_go_on,
                   opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_SIZE_T OVar1;
  OPJ_SIZE_T OVar2;
  uint uVar3;
  opj_bool oVar4;
  OPJ_BYTE *pOVar5;
  OPJ_OFF_T OVar6;
  ulong uVar7;
  OPJ_INT32 *in_RCX;
  OPJ_UINT32 *in_RDX;
  OPJ_UINT32 *in_RSI;
  opj_j2k_v2_t *in_RDI;
  OPJ_INT32 *in_R8;
  opj_j2k_v2_t *in_R9;
  bool bVar8;
  OPJ_INT32 *in_stack_00000008;
  OPJ_UINT32 *in_stack_00000010;
  undefined4 *in_stack_00000018;
  OPJ_UINT32 sot_pos;
  OPJ_UINT32 l_nb_tiles;
  opj_tcp_v2_t *l_tcp;
  opj_dec_memory_marker_handler_t *l_marker_handler;
  OPJ_UINT32 l_marker_size;
  OPJ_UINT32 l_current_marker;
  OPJ_UINT32 in_stack_000000c4;
  opj_tcd_v2_t *in_stack_000000c8;
  OPJ_OFF_T in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  OPJ_UINT32 in_stack_ffffffffffffff94;
  opj_codestream_index_t *in_stack_ffffffffffffff98;
  OPJ_UINT32 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  opj_tcp_v2_t *local_50;
  opj_event_mgr *p_manager_00;
  uint in_stack_ffffffffffffffc0;
  OPJ_UINT32 OVar9;
  
  OVar9 = 0xff90;
  p_manager_00 = (opj_event_mgr *)0x0;
  if ((in_RDI->m_specific_param).m_decoder.m_state == 0x100) {
    OVar9 = 0xffd9;
  }
  else if ((in_RDI->m_specific_param).m_decoder.m_state != 8) {
    return 0;
  }
  do {
    uVar3 = in_stack_ffffffffffffffa4 & 0xffffff;
    if ((*(byte *)((long)&in_RDI->m_specific_param + 0x54) & 1) == 0) {
      uVar3 = CONCAT13(OVar9 != 0xffd9,(int3)in_stack_ffffffffffffffa4);
    }
    in_stack_ffffffffffffffa4 = uVar3;
    if ((char)(in_stack_ffffffffffffffa4 >> 0x18) == '\0') {
      if ((OVar9 == 0xffd9) && ((in_RDI->m_specific_param).m_decoder.m_state != 0x100)) {
        in_RDI->m_current_tile_number = 0;
        (in_RDI->m_specific_param).m_decoder.m_state = 0x100;
      }
      if ((*(byte *)((long)&in_RDI->m_specific_param + 0x54) & 1) == 0) {
        local_50 = (in_RDI->m_cp).tcps + in_RDI->m_current_tile_number;
        uVar3 = (in_RDI->m_cp).th * (in_RDI->m_cp).tw;
        while( true ) {
          bVar8 = false;
          if (in_RDI->m_current_tile_number < uVar3) {
            bVar8 = local_50->m_data == (OPJ_BYTE *)0x0;
          }
          if (!bVar8) break;
          in_RDI->m_current_tile_number = in_RDI->m_current_tile_number + 1;
          local_50 = local_50 + 1;
        }
        if (in_RDI->m_current_tile_number == uVar3) {
          *in_stack_00000018 = 0;
          return 1;
        }
      }
      oVar4 = tcd_init_decode_tile(in_stack_000000c8,in_stack_000000c4);
      if (oVar4 == 0) {
        opj_event_msg_v2((opj_event_mgr_t *)l_tcp,1,"Cannot decode tile, memory error\n");
        return 0;
      }
      opj_event_msg_v2((opj_event_mgr_t *)l_tcp,4,"Header of tile %d / %d has been read.\n",
                       (ulong)in_RDI->m_current_tile_number,
                       (ulong)((in_RDI->m_cp).th * (in_RDI->m_cp).tw - 1));
      *in_RSI = in_RDI->m_current_tile_number;
      *in_stack_00000018 = 1;
      OVar9 = tcd_get_decoded_tile_size(in_RDI->m_tcd);
      *in_RDX = OVar9;
      *in_RCX = in_RDI->m_tcd->tcd_image->tiles->x0;
      *in_R8 = in_RDI->m_tcd->tcd_image->tiles->y0;
      in_R9->m_is_decoder = in_RDI->m_tcd->tcd_image->tiles->x1;
      *in_stack_00000008 = in_RDI->m_tcd->tcd_image->tiles->y1;
      *in_stack_00000010 = in_RDI->m_tcd->tcd_image->tiles->numcomps;
      (in_RDI->m_specific_param).m_decoder.m_state =
           (in_RDI->m_specific_param).m_decoder.m_state | 0x80;
      return 1;
    }
    while (OVar2 = (OPJ_SIZE_T)((ulong)in_stack_ffffffffffffff98 >> 0x20), OVar9 != 0xff93) {
      OVar1 = opj_stream_read_data
                        ((opj_stream_private_t *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (OPJ_BYTE *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         OVar2,(opj_event_mgr_t *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (OVar1 != 2) {
        opj_event_msg_v2((opj_event_mgr_t *)l_tcp,1,"Stream too short\n");
        return 0;
      }
      opj_read_bytes_LE((in_RDI->m_specific_param).m_decoder.m_header_data,
                        (OPJ_UINT32 *)&stack0xffffffffffffffc0,2);
      if (((in_RDI->m_specific_param).m_decoder.m_state & 0x10) != 0) {
        (in_RDI->m_specific_param).m_decoder.m_sot_length =
             (in_RDI->m_specific_param).m_decoder.m_sot_length - (in_stack_ffffffffffffffc0 + 2);
      }
      in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 - 2;
      p_manager_00 = (opj_event_mgr *)j2k_get_marker_handler(OVar9);
      if (((in_RDI->m_specific_param).m_decoder.m_state &
          *(OPJ_UINT32 *)((long)&p_manager_00->client_data + 4)) == 0) {
        opj_event_msg_v2((opj_event_mgr_t *)l_tcp,1,"Marker is not compliant with its position\n");
        return 0;
      }
      if ((in_RDI->m_specific_param).m_decoder.m_header_data_size < in_stack_ffffffffffffffc0) {
        pOVar5 = (OPJ_BYTE *)
                 realloc((in_RDI->m_specific_param).m_decoder.m_header_data,
                         (ulong)in_stack_ffffffffffffffc0);
        (in_RDI->m_specific_param).m_decoder.m_header_data = pOVar5;
        if ((in_RDI->m_specific_param).m_decoder.m_header_data == (OPJ_BYTE *)0x0) {
          return 0;
        }
        (in_RDI->m_specific_param).m_decoder.m_header_data_size = in_stack_ffffffffffffffc0;
      }
      OVar2 = opj_stream_read_data
                        ((opj_stream_private_t *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (OPJ_BYTE *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         OVar2,(opj_event_mgr_t *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (OVar2 != in_stack_ffffffffffffffc0) {
        opj_event_msg_v2((opj_event_mgr_t *)l_tcp,1,"Stream too short\n");
        return 0;
      }
      oVar4 = (*p_manager_00->error_handler)
                        (in_RDI,(in_RDI->m_specific_param).m_decoder.m_header_data,
                         in_stack_ffffffffffffffc0,(opj_event_mgr *)l_tcp);
      if (oVar4 == 0) {
        opj_event_msg_v2((opj_event_mgr_t *)l_tcp,1,
                         "Fail to read the current marker segment (%#x)\n",(ulong)OVar9);
        return 0;
      }
      in_stack_ffffffffffffff94 = in_RDI->m_current_tile_number;
      in_stack_ffffffffffffff98 = in_RDI->cstr_index;
      in_stack_ffffffffffffffa0 = *(OPJ_UINT32 *)&p_manager_00->client_data;
      opj_stream_tell(_sot_pos);
      j2k_add_tlmarker_v2(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                          in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,0);
      if (*(OPJ_UINT32 *)&p_manager_00->client_data == 0xff90) {
        OVar6 = opj_stream_tell(_sot_pos);
        in_stack_ffffffffffffffa8 = ((int)OVar6 - in_stack_ffffffffffffffc0) - 4;
        if ((in_RDI->m_specific_param).m_decoder.m_last_sot_read_pos <
            (long)(ulong)in_stack_ffffffffffffffa8) {
          *(ulong *)((long)&in_RDI->m_specific_param + 0x48) = (ulong)in_stack_ffffffffffffffa8;
        }
      }
      if ((*(byte *)((long)&in_RDI->m_specific_param + 0x54) >> 2 & 1) == 0) {
        OVar2 = opj_stream_read_data
                          ((opj_stream_private_t *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (OPJ_BYTE *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                           ,(OPJ_SIZE_T)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                           (opj_event_mgr_t *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        if (OVar2 != 2) {
          opj_event_msg_v2((opj_event_mgr_t *)l_tcp,1,"Stream too short\n");
          return 0;
        }
        opj_read_bytes_LE((in_RDI->m_specific_param).m_decoder.m_header_data,
                          (OPJ_UINT32 *)&stack0xffffffffffffffc4,2);
      }
      else {
        uVar7 = opj_stream_skip((opj_stream_private_t *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                in_stack_ffffffffffffff88,(opj_event_mgr_t *)0x2b494e);
        if (uVar7 != (in_RDI->m_specific_param).m_decoder.m_sot_length) {
          opj_event_msg_v2((opj_event_mgr_t *)l_tcp,1,"Stream too short\n");
          return 0;
        }
        OVar9 = 0xff93;
      }
    }
    if ((*(byte *)((long)&in_RDI->m_specific_param + 0x54) >> 2 & 1) == 0) {
      oVar4 = j2k_read_sod_v2(in_R9,(opj_stream_private *)CONCAT44(0xff93,in_stack_ffffffffffffffc0)
                              ,p_manager_00);
      if (oVar4 == 0) {
        return 0;
      }
      if ((*(byte *)((long)&in_RDI->m_specific_param + 0x54) & 1) == 0) {
        OVar2 = opj_stream_read_data
                          ((opj_stream_private_t *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (OPJ_BYTE *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                           ,(OPJ_SIZE_T)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                           (opj_event_mgr_t *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        if (OVar2 != 2) {
          opj_event_msg_v2((opj_event_mgr_t *)l_tcp,1,"Stream too short\n");
          return 0;
        }
        opj_read_bytes_LE((in_RDI->m_specific_param).m_decoder.m_header_data,
                          (OPJ_UINT32 *)&stack0xffffffffffffffc4,2);
      }
    }
    else {
      *(byte *)((long)&in_RDI->m_specific_param + 0x54) =
           *(byte *)((long)&in_RDI->m_specific_param + 0x54) & 0xfb;
      *(byte *)((long)&in_RDI->m_specific_param + 0x54) =
           *(byte *)((long)&in_RDI->m_specific_param + 0x54) & 0xfe;
      (in_RDI->m_specific_param).m_decoder.m_state = 8;
      OVar2 = opj_stream_read_data
                        ((opj_stream_private_t *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (OPJ_BYTE *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         OVar2,(opj_event_mgr_t *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (OVar2 != 2) {
        opj_event_msg_v2((opj_event_mgr_t *)l_tcp,1,"Stream too short\n");
        return 0;
      }
      opj_read_bytes_LE((in_RDI->m_specific_param).m_decoder.m_header_data,
                        (OPJ_UINT32 *)&stack0xffffffffffffffc4,2);
    }
  } while( true );
}

Assistant:

opj_bool j2k_read_tile_header(	opj_j2k_v2_t * p_j2k,
					 	 	 	OPJ_UINT32 * p_tile_index,
					 	 	 	OPJ_UINT32 * p_data_size,
					 	 	 	OPJ_INT32 * p_tile_x0, OPJ_INT32 * p_tile_y0,
					 	 	 	OPJ_INT32 * p_tile_x1, OPJ_INT32 * p_tile_y1,
								OPJ_UINT32 * p_nb_comps,
								opj_bool * p_go_on,
								opj_stream_private_t *p_stream,
								opj_event_mgr_t * p_manager )
{
	OPJ_UINT32 l_current_marker = J2K_MS_SOT;
	OPJ_UINT32 l_marker_size;
	const opj_dec_memory_marker_handler_t * l_marker_handler = 00;
	opj_tcp_v2_t * l_tcp = NULL;
	OPJ_UINT32 l_nb_tiles;

	/* preconditions */
	assert(p_stream != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	/* Reach the End Of Codestream ?*/
	if (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_EOC){
		l_current_marker = J2K_MS_EOC;
	}
	/* We need to encounter a SOT marker (a new tile-part header) */
	else if	(p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_TPHSOT){
		return OPJ_FALSE;
	}

	/* Read into the codestream until reach the EOC or ! can_decode ??? FIXME */
	while ( (!p_j2k->m_specific_param.m_decoder.m_can_decode) && (l_current_marker != J2K_MS_EOC) ) {

		/* Try to read until the Start Of Data is detected */
		while (l_current_marker != J2K_MS_SOD) {

			/* Try to read 2 bytes (the marker size) from stream and copy them into the buffer */
			if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
				return OPJ_FALSE;
			}

			/* Read 2 bytes from the buffer as the marker size */
			opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_marker_size,2);

			/* Why this condition? FIXME */
			if (p_j2k->m_specific_param.m_decoder.m_state & J2K_STATE_TPH){
				p_j2k->m_specific_param.m_decoder.m_sot_length -= (l_marker_size + 2);
			}
			l_marker_size -= 2; /* Subtract the size of the marker ID already read */

			/* Get the marker handler from the marker ID */
			l_marker_handler = j2k_get_marker_handler(l_current_marker);

			/* Check if the marker is known and if it is the right place to find it */
			if (! (p_j2k->m_specific_param.m_decoder.m_state & l_marker_handler->states) ) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Marker is not compliant with its position\n");
				return OPJ_FALSE;
			}
/* FIXME manage case of unknown marker as in the main header ? */

			/* Check if the marker size is compatible with the header data size */
			if (l_marker_size > p_j2k->m_specific_param.m_decoder.m_header_data_size) {
				p_j2k->m_specific_param.m_decoder.m_header_data = (OPJ_BYTE*)
					opj_realloc(p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size);
				if (p_j2k->m_specific_param.m_decoder.m_header_data == 00) {
					return OPJ_FALSE;
				}
				p_j2k->m_specific_param.m_decoder.m_header_data_size = l_marker_size;
			}

			/* Try to read the rest of the marker segment from stream and copy them into the buffer */
			if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager) != l_marker_size) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
				return OPJ_FALSE;
			}

			/* Read the marker segment with the correct marker handler */
			if (! (*(l_marker_handler->handler))(p_j2k,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager)) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Fail to read the current marker segment (%#x)\n", l_current_marker);
				return OPJ_FALSE;
			}

			/* Add the marker to the codestream index*/
			j2k_add_tlmarker_v2(p_j2k->m_current_tile_number,
								p_j2k->cstr_index,
								l_marker_handler->id,
								(OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4,
								l_marker_size + 4 );

			/* Keep the position of the last SOT marker read */
			if ( l_marker_handler->id == J2K_MS_SOT ) {
				OPJ_UINT32 sot_pos = (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4 ;
				if (sot_pos > p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos)
				{
					p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos = sot_pos;
				}
			}


			if (p_j2k->m_specific_param.m_decoder.m_skip_data) {
				/* Skip the rest of the tile part header*/
				if (opj_stream_skip(p_stream,p_j2k->m_specific_param.m_decoder.m_sot_length,p_manager) != p_j2k->m_specific_param.m_decoder.m_sot_length) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
					return OPJ_FALSE;
				}
				l_current_marker = J2K_MS_SOD; /* Normally we reached a SOD */
			}
			else {
				/* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer*/
				if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
					return OPJ_FALSE;
				}
				/* Read 2 bytes from the buffer as the new marker ID */
				opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
			}
		}

		/* If we didn't skip data before, we need to read the SOD marker*/
		if (! p_j2k->m_specific_param.m_decoder.m_skip_data) {
			/* Try to read the SOD marker and skip data ? FIXME */
			if (! j2k_read_sod_v2(p_j2k, p_stream, p_manager)) {
				return OPJ_FALSE;
			}



			if (! p_j2k->m_specific_param.m_decoder.m_can_decode){
				/* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
				if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
					return OPJ_FALSE;
				}

				/* Read 2 bytes from buffer as the new marker ID */
				opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
			}
		}
		else {
			/* Indicate we will try to read a new tile-part header*/
			p_j2k->m_specific_param.m_decoder.m_skip_data = 0;
			p_j2k->m_specific_param.m_decoder.m_can_decode = 0;
			p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_TPHSOT;

			/* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
			if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
				return OPJ_FALSE;
			}

			/* Read 2 bytes from buffer as the new marker ID */
			opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
		}
	}

	/* Current marker is the EOC marker ?*/
	if (l_current_marker == J2K_MS_EOC) {
		if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_EOC ){
			p_j2k->m_current_tile_number = 0;
			p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_EOC;
		}
	}

	/* FIXME DOC ???*/
	if ( ! p_j2k->m_specific_param.m_decoder.m_can_decode) {
		l_tcp = p_j2k->m_cp.tcps + p_j2k->m_current_tile_number;
		l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;

		while( (p_j2k->m_current_tile_number < l_nb_tiles) && (l_tcp->m_data == 00) ) {
			++p_j2k->m_current_tile_number;
			++l_tcp;
		}

		if (p_j2k->m_current_tile_number == l_nb_tiles) {
			*p_go_on = OPJ_FALSE;
			return OPJ_TRUE;
		}
	}

	/*FIXME ???*/
	if (! tcd_init_decode_tile(p_j2k->m_tcd, p_j2k->m_current_tile_number)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Cannot decode tile, memory error\n");
		return OPJ_FALSE;
	}

	opj_event_msg_v2(p_manager, EVT_INFO, "Header of tile %d / %d has been read.\n",
			p_j2k->m_current_tile_number, (p_j2k->m_cp.th * p_j2k->m_cp.tw) - 1);

	*p_tile_index = p_j2k->m_current_tile_number;
	*p_go_on = OPJ_TRUE;
	*p_data_size = tcd_get_decoded_tile_size(p_j2k->m_tcd);
	*p_tile_x0 = p_j2k->m_tcd->tcd_image->tiles->x0;
	*p_tile_y0 = p_j2k->m_tcd->tcd_image->tiles->y0;
	*p_tile_x1 = p_j2k->m_tcd->tcd_image->tiles->x1;
	*p_tile_y1 = p_j2k->m_tcd->tcd_image->tiles->y1;
	*p_nb_comps = p_j2k->m_tcd->tcd_image->tiles->numcomps;

	 p_j2k->m_specific_param.m_decoder.m_state |= 0x0080;/* FIXME J2K_DEC_STATE_DATA;*/

	return OPJ_TRUE;
}